

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schema.c++
# Opt level: O1

EnumerantList * __thiscall
capnp::EnumSchema::getEnumerants(EnumerantList *__return_storage_ptr__,EnumSchema *this)

{
  RawBrandedSchema *pRVar1;
  StructReader local_78;
  PointerReader local_48;
  
  pRVar1 = (this->super_Schema).raw;
  local_48.pointer = (WirePointer *)pRVar1->generic->encodedNode;
  local_48.segment = (SegmentReader *)0x0;
  local_48.capTable = (CapTableReader *)0x0;
  local_48.nestingLimit = 0x7fffffff;
  _::PointerReader::getStruct(&local_78,&local_48,(word *)0x0);
  local_48.pointer = (WirePointer *)0x0;
  local_48.segment = (SegmentReader *)0x0;
  local_48.capTable = (CapTableReader *)0x0;
  local_48.nestingLimit = 0x7fffffff;
  if (3 < local_78.pointerCount) {
    local_48.pointer = local_78.pointers + 3;
    local_48.segment = local_78.segment;
    local_48.capTable = local_78.capTable;
    local_48.nestingLimit = local_78.nestingLimit;
  }
  _::PointerReader::getList
            (&(__return_storage_ptr__->list).reader,&local_48,INLINE_COMPOSITE,(word *)0x0);
  (__return_storage_ptr__->parent).super_Schema.raw = pRVar1;
  return __return_storage_ptr__;
}

Assistant:

EnumSchema::EnumerantList EnumSchema::getEnumerants() const {
  return EnumerantList(*this, getProto().getEnum().getEnumerants());
}